

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitCommonExpr
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,CommonExpr e)

{
  int in_EDX;
  ExprBase in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  BasicStringRef<char> *this_00;
  BasicWriter<char> *in_stack_ffffffffffffffc0;
  BasicStringRef<char> in_stack_ffffffffffffffc8;
  
  this_00 = *(BasicStringRef<char> **)(in_RDI + 8);
  Reference::index((Reference *)&stack0xfffffffffffffff8,(char *)in_RSI.impl_,in_EDX);
  GenericVarNamer::dvname_abi_cxx11_((int)((ulong)in_RSI.impl_ >> 0x20));
  fmt::BasicStringRef<char>::BasicStringRef(this_00,in_stack_ffffffffffffff98);
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void VisitCommonExpr(CommonExpr e)
  { writer_ << vnam_.dvname(e.index()); }